

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

bool __thiscall
Timidity::Renderer::start_region(Renderer *this,int chan,int note,int vel,Sample *sp,float f)

{
  int i;
  Voice *v_00;
  float fVar1;
  double dVar2;
  double local_48;
  double pan;
  Voice *v;
  int voicenum;
  float f_local;
  Sample *sp_local;
  int vel_local;
  int note_local;
  int chan_local;
  Renderer *this_local;
  
  i = allocate_voice(this);
  if (i < 0) {
    this_local._7_1_ = false;
  }
  else {
    v_00 = this->voice + i;
    v_00->sample = sp;
    if (sp->type == '\0') {
      v_00->orig_frequency = f;
    }
    else if (sp->scale_factor == 0x400) {
      if (sp->tune == 0) {
        dVar2 = pow(2.0,(double)note / 12.0);
        v_00->orig_frequency = (float)(dVar2 * 8175.798947309669);
      }
      else {
        dVar2 = pow(2.0,((double)note + (double)(int)sp->tune * 0.01) / 12.0);
        v_00->orig_frequency = (float)(dVar2 * 8175.798947309669);
      }
    }
    else {
      fVar1 = calculate_scaled_frequency(this,sp,note);
      v_00->orig_frequency = fVar1;
    }
    v_00->status = '\x01';
    v_00->channel = (BYTE)chan;
    v_00->note = (BYTE)note;
    v_00->velocity = (BYTE)vel;
    v_00->sample_offset = 0;
    v_00->sample_increment = 0;
    v_00->sample_count = 0;
    v_00->tremolo_phase = 0;
    v_00->tremolo_phase_increment = v_00->sample->tremolo_phase_increment;
    v_00->tremolo_sweep = v_00->sample->tremolo_sweep_increment;
    v_00->tremolo_sweep_position = 0;
    v_00->vibrato_sweep = v_00->sample->vibrato_sweep_increment;
    v_00->vibrato_sweep_position = 0;
    v_00->vibrato_control_ratio = v_00->sample->vibrato_control_ratio;
    v_00->vibrato_phase = 0;
    v_00->vibrato_control_counter = 0;
    kill_key_group(this,i);
    memset(v_00->vibrato_sample_increment,0,0x80);
    if (sp->type == '\x02') {
      if (this->channel[chan].panning == -1) {
        local_48 = (double)(sp->panning + 500) / 1000.0;
      }
      else {
        local_48 = (double)(int)this->channel[chan].panning / 128.0 +
                   (double)(int)sp->panning / 1000.0;
      }
      compute_pan(local_48,(uint)sp->type,&v_00->left_offset,&v_00->right_offset);
    }
    else if (this->channel[chan].panning == -1) {
      v_00->left_offset = v_00->sample->left_offset;
      v_00->right_offset = v_00->sample->right_offset;
    }
    else {
      compute_pan((double)(int)this->channel[chan].panning / 128.0,(uint)sp->type,&v_00->left_offset
                  ,&v_00->right_offset);
    }
    recompute_freq(this,i);
    recompute_amp(this,v_00);
    v_00->control_counter = 0;
    Envelope::Init(&v_00->eg1,this,v_00);
    if ((v_00->sample->modes & 4) != 0) {
      v_00->status = v_00->status | 0x10;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Renderer::start_region(int chan, int note, int vel, Sample *sp, float f)
{
	int voicenum;
	Voice *v;

	voicenum = allocate_voice();
	if (voicenum < 0)
	{
		return false;
	}
	v = &voice[voicenum];
	v->sample = sp;

	if (sp->type == INST_GUS)
	{
		v->orig_frequency = f;
	}
	else
	{
		if (sp->scale_factor != 1024)
		{
			v->orig_frequency = calculate_scaled_frequency(sp, note);
		}
		else if (sp->tune != 0)
		{
			v->orig_frequency = note_to_freq(note + sp->tune * 0.01);
		}
		else
		{
			v->orig_frequency = note_to_freq(note);
		}
	}

	v->status = VOICE_RUNNING;
	v->channel = chan;
	v->note = note;
	v->velocity = vel;
	v->sample_offset = 0;
	v->sample_increment = 0; /* make sure it isn't negative */
	v->sample_count = 0;

	v->tremolo_phase = 0;
	v->tremolo_phase_increment = v->sample->tremolo_phase_increment;
	v->tremolo_sweep = v->sample->tremolo_sweep_increment;
	v->tremolo_sweep_position = 0;

	v->vibrato_sweep = v->sample->vibrato_sweep_increment;
	v->vibrato_sweep_position = 0;
	v->vibrato_control_ratio = v->sample->vibrato_control_ratio;
	v->vibrato_control_counter = v->vibrato_phase = 0;

	kill_key_group(voicenum);

	memset(v->vibrato_sample_increment, 0, sizeof(v->vibrato_sample_increment));

	if (sp->type == INST_SF2)
	{
		// Channel pan is added to instrument pan.
		double pan;
		if (channel[chan].panning == NO_PANNING)
		{
			pan = (sp->panning + 500) / 1000.0;
		}
		else
		{
			pan = channel[chan].panning / 128.0 + sp->panning / 1000.0;
		}
		compute_pan(pan, sp->type, v->left_offset, v->right_offset);
	}
	else if (channel[chan].panning != NO_PANNING)
	{
		compute_pan(channel[chan].panning / 128.0, sp->type, v->left_offset, v->right_offset);
	}
	else
	{
		v->left_offset = v->sample->left_offset;
		v->right_offset = v->sample->right_offset;
	}

	recompute_freq(voicenum);
	recompute_amp(v);
	v->control_counter = 0;

	v->eg1.Init(this, v);

	if (v->sample->modes & PATCH_LOOPEN)
	{
		v->status |= VOICE_LPE;
	}
	return true;
}